

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::Expression::Deserialize(Expression *this,Deserializer *deserializer)

{
  ulong *puVar1;
  ExpressionClass EVar2;
  ExpressionType EVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  pointer pEVar7;
  SerializationException *this_00;
  pointer pcVar8;
  string str;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  char local_38 [16];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"expression_class");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_48,deserializer);
    EVar2 = EnumUtil::FromString<duckdb::ExpressionClass>((char *)local_48._M_allocated_capacity);
    uVar4 = (uint)EVar2;
    if ((char *)local_48._M_allocated_capacity != local_38) {
      operator_delete((void *)local_48._M_allocated_capacity);
    }
  }
  else {
    uVar4 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_48,deserializer);
    EVar3 = EnumUtil::FromString<duckdb::ExpressionType>((char *)local_48._M_allocated_capacity);
    uVar5 = (uint)EVar3;
    if ((char *)local_48._M_allocated_capacity != local_38) {
      operator_delete((void *)local_48._M_allocated_capacity);
    }
  }
  else {
    uVar5 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar6 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"alias");
  if ((char)iVar6 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_48._M_allocated_capacity = (size_type)local_38;
    local_38[0] = '\0';
    local_48._8_8_ = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_48,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar6 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"query_location");
  if ((char)iVar6 == '\0') {
    pcVar8 = (pointer)0xffffffffffffffff;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar6 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    if (CONCAT44(extraout_var,iVar6) == 0xffffffffffffffff) {
      pcVar8 = (pointer)0xffffffffffffffff;
    }
    else {
      optional_idx::optional_idx((optional_idx *)local_68,CONCAT44(extraout_var,iVar6));
      pcVar8 = (pointer)local_68._0_8_;
    }
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  local_68._0_8_ = ZEXT48(uVar5 & 0xff);
  puVar1 = (deserializer->data).enums.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar1 == (deserializer->data).enums.c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
              (&(deserializer->data).enums.c,(unsigned_long *)local_68);
  }
  else {
    *puVar1 = local_68._0_8_;
    (deserializer->data).enums.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar1 + 1;
  }
  (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)0x0;
  switch(uVar4 & 0xff) {
  case 0x19:
    BoundAggregateExpression::Deserialize((BoundAggregateExpression *)local_68,deserializer);
    break;
  case 0x1a:
    BoundCaseExpression::Deserialize((BoundCaseExpression *)local_68,deserializer);
    break;
  case 0x1b:
    BoundCastExpression::Deserialize((BoundCastExpression *)local_68,deserializer);
    break;
  case 0x1c:
    BoundColumnRefExpression::Deserialize((BoundColumnRefExpression *)local_68,deserializer);
    break;
  case 0x1d:
    BoundComparisonExpression::Deserialize((BoundComparisonExpression *)local_68,deserializer);
    break;
  case 0x1e:
    BoundConjunctionExpression::Deserialize((BoundConjunctionExpression *)local_68,deserializer);
    break;
  case 0x1f:
    BoundConstantExpression::Deserialize((BoundConstantExpression *)local_68,deserializer);
    break;
  case 0x20:
    BoundDefaultExpression::Deserialize((BoundDefaultExpression *)local_68,deserializer);
    break;
  case 0x21:
    BoundFunctionExpression::Deserialize((BoundFunctionExpression *)local_68,deserializer);
    break;
  case 0x22:
    BoundOperatorExpression::Deserialize((BoundOperatorExpression *)local_68,deserializer);
    break;
  case 0x23:
    BoundParameterExpression::Deserialize((BoundParameterExpression *)local_68,deserializer);
    break;
  case 0x24:
    BoundReferenceExpression::Deserialize((BoundReferenceExpression *)local_68,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_68._0_8_ = local_68 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Unsupported type for deserialization of Expression!","");
    SerializationException::SerializationException(this_00,(string *)local_68);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case 0x26:
    BoundWindowExpression::Deserialize((BoundWindowExpression *)local_68,deserializer);
    break;
  case 0x27:
    BoundBetweenExpression::Deserialize((BoundBetweenExpression *)local_68,deserializer);
    break;
  case 0x28:
    BoundUnnestExpression::Deserialize((BoundUnnestExpression *)local_68,deserializer);
    break;
  case 0x29:
    BoundLambdaExpression::Deserialize((BoundLambdaExpression *)local_68,deserializer);
    break;
  case 0x2a:
    BoundLambdaRefExpression::Deserialize((BoundLambdaRefExpression *)local_68,deserializer);
  }
  (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)local_68._0_8_;
  Deserializer::Unset<duckdb::ExpressionType>(deserializer);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)this);
  ::std::__cxx11::string::operator=
            ((string *)&(pEVar7->super_BaseExpression).alias,(string *)&local_48);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)this);
  (pEVar7->super_BaseExpression).query_location.index = (idx_t)pcVar8;
  if ((char *)local_48._M_allocated_capacity != local_38) {
    operator_delete((void *)local_48._M_allocated_capacity);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> Expression::Deserialize(Deserializer &deserializer) {
	auto expression_class = deserializer.ReadProperty<ExpressionClass>(100, "expression_class");
	auto type = deserializer.ReadProperty<ExpressionType>(101, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(102, "alias");
	auto query_location = deserializer.ReadPropertyWithExplicitDefault<optional_idx>(103, "query_location", optional_idx());
	deserializer.Set<ExpressionType>(type);
	unique_ptr<Expression> result;
	switch (expression_class) {
	case ExpressionClass::BOUND_AGGREGATE:
		result = BoundAggregateExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_BETWEEN:
		result = BoundBetweenExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_CASE:
		result = BoundCaseExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_CAST:
		result = BoundCastExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_COLUMN_REF:
		result = BoundColumnRefExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_COMPARISON:
		result = BoundComparisonExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_CONJUNCTION:
		result = BoundConjunctionExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_CONSTANT:
		result = BoundConstantExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_DEFAULT:
		result = BoundDefaultExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_FUNCTION:
		result = BoundFunctionExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_LAMBDA:
		result = BoundLambdaExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_LAMBDA_REF:
		result = BoundLambdaRefExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_OPERATOR:
		result = BoundOperatorExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_PARAMETER:
		result = BoundParameterExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_REF:
		result = BoundReferenceExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_UNNEST:
		result = BoundUnnestExpression::Deserialize(deserializer);
		break;
	case ExpressionClass::BOUND_WINDOW:
		result = BoundWindowExpression::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of Expression!");
	}
	deserializer.Unset<ExpressionType>();
	result->alias = std::move(alias);
	result->query_location = query_location;
	return result;
}